

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::anon_unknown_2::GenerateCMessage
               (Descriptor *message,Printer *printer)

{
  undefined8 uVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  byte bVar4;
  FieldDescriptor *pFVar5;
  OneofDescriptor *pOVar6;
  Descriptor *message_00;
  EnumDescriptor *desc;
  char *pcVar7;
  FileDescriptor *file;
  int i;
  int iVar8;
  size_t sVar9;
  undefined1 uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  size_t sStackY_100;
  string c_name;
  undefined1 local_b8 [24];
  code *pcStack_a0;
  undefined8 local_98;
  string local_90;
  string php_name;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  uVar1 = *(undefined8 *)(*(long *)(message + 8) + 0x20);
  uVar2 = *(undefined8 *)(*(long *)(message + 8) + 0x28);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)local_b8,(char (*) [2])0x41082e,(char (*) [2])0x3f33d2);
  absl::lts_20240722::StrReplaceAll_abi_cxx11_
            (&c_name,uVar2,uVar1,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)local_b8,1);
  local_b8._16_8_ = 0;
  local_98 = (MaybeInitializedPtr)0x0;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (char *)0x0;
  pcStack_a0 = google::protobuf::internal::TypeCardToString_abi_cxx11_;
  FullClassName<google::protobuf::Descriptor>(&local_90,message,(Options *)local_b8);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_50,(char (*) [2])0x2b21fb,(char (*) [3])"\\\\");
  absl::lts_20240722::StrReplaceAll_abi_cxx11_
            (&php_name,local_90._M_string_length,local_90._M_dataplus._M_p,&local_50,1);
  std::__cxx11::string::~string((string *)&local_90);
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_b8 + 8));
  (anonymous_namespace)::FilenameCName_abi_cxx11_
            ((string *)local_b8,*(_anonymous_namespace_ **)(message + 0x10),file);
  pcVar7 = "file_c_name";
  text._M_str = 
  "/* $c_name$ */\n\nzend_class_entry* $c_name$_ce;\n\nstatic PHP_METHOD($c_name$, __construct) {\n  $file_c_name$_AddDescriptor();\n  zim_Message___construct(INTERNAL_FUNCTION_PARAM_PASSTHRU);\n}\n\n"
  ;
  text._M_len = 0xbc;
  pbVar11 = (string *)local_b8;
  io::Printer::Print<char[12],std::__cxx11::string,char[7],std::__cxx11::string>
            (printer,text,(char (*) [12])"file_c_name",(string *)local_b8,(char (*) [7])0x3ee61e,
             &c_name);
  std::__cxx11::string::~string((string *)local_b8);
  for (iVar8 = 0; uVar10 = SUB81(pbVar11,0), iVar8 < *(int *)(message + 4); iVar8 = iVar8 + 1) {
    pFVar5 = Descriptor::field(message,iVar8);
    pbVar3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pFVar5 + 8);
    name._M_str = pcVar7;
    name._M_len = (size_t)(pbVar3->_M_dataplus)._M_p;
    (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              ((string *)local_b8,(_anonymous_namespace_ *)pbVar3->_M_string_length,name,
               (bool)uVar10);
    pcVar7 = "c_name";
    pbVar11 = &c_name;
    text_00._M_str =
         "static PHP_METHOD($c_name$, get$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_FieldDef *f = upb_MessageDef_FindFieldByName(\n      intern->desc->msgdef, \"$name$\");\n  zval ret;\n  Message_get(intern, f, &ret);\n  RETURN_COPY_VALUE(&ret);\n}\n\nstatic PHP_METHOD($c_name$, set$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_FieldDef *f = upb_MessageDef_FindFieldByName(\n      intern->desc->msgdef, \"$name$\");\n  zval *val;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"z\", &val)\n      == FAILURE) {\n    return;\n  }\n  Message_set(intern, f, val);\n  RETURN_COPY(getThis());\n}\n\n"
    ;
    text_00._M_len = 0x273;
    io::Printer::
    Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,text_00,(char (*) [7])0x3ee61e,pbVar11,(char (*) [5])0x3f02df,pbVar3,
               (char (*) [11])0x36f86e,(string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
  }
  for (iVar8 = 0; uVar10 = SUB81(pbVar11,0), iVar8 < *(int *)(message + 0x7c); iVar8 = iVar8 + 1) {
    pOVar6 = Descriptor::oneof_decl(message,iVar8);
    pbVar3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pOVar6 + 8);
    name_00._M_str = pcVar7;
    name_00._M_len = (size_t)(pbVar3->_M_dataplus)._M_p;
    (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              ((string *)local_b8,(_anonymous_namespace_ *)pbVar3->_M_string_length,name_00,
               (bool)uVar10);
    pcVar7 = "c_name";
    pbVar11 = &c_name;
    text_01._M_str =
         "static PHP_METHOD($c_name$, get$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_OneofDef *oneof = upb_MessageDef_FindOneofByName(\n      intern->desc->msgdef, \"$name$\");\n  const upb_FieldDef *field = \n      upb_Message_WhichOneofByDef(intern->msg, oneof);\n  RETURN_STRING(field ? upb_FieldDef_Name(field) : \"\");\n}\n"
    ;
    text_01._M_len = 0x156;
    io::Printer::
    Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,text_01,(char (*) [7])0x3ee61e,pbVar11,(char (*) [5])0x3f02df,pbVar3,
               (char (*) [11])0x36f86e,(string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
  }
  bVar4 = (byte)message[1] >> 2 & 0x1f;
  if (bVar4 == 10) {
    pcVar7 = 
    "ZEND_BEGIN_ARG_INFO_EX(arginfo_is, 0, 0, 1)\n  ZEND_ARG_INFO(0, proto)\nZEND_END_ARG_INFO()\n\n"
    ;
    sStackY_100 = 0x5b;
LAB_00273780:
    text_02._M_str = pcVar7;
    text_02._M_len = sStackY_100;
    io::Printer::Print<>(printer,text_02);
  }
  else if (bVar4 == 0xd) {
    pcVar7 = 
    "ZEND_BEGIN_ARG_INFO_EX(arginfo_timestamp_fromdatetime, 0, 0, 1)\n  ZEND_ARG_INFO(0, datetime)\nZEND_END_ARG_INFO()\n\n"
    ;
    sStackY_100 = 0x72;
    goto LAB_00273780;
  }
  pcVar7 = "c_name";
  pbVar11 = &c_name;
  text_03._M_str =
       "static zend_function_entry $c_name$_phpmethods[] = {\n  PHP_ME($c_name$, __construct, arginfo_construct, ZEND_ACC_PUBLIC)\n"
  ;
  text_03._M_len = 0x79;
  io::Printer::Print<char[7],std::__cxx11::string>(printer,text_03,(char (*) [7])0x3ee61e,pbVar11);
  for (iVar8 = 0; uVar10 = SUB81(pbVar11,0), iVar8 < *(int *)(message + 4); iVar8 = iVar8 + 1) {
    pFVar5 = Descriptor::field(message,iVar8);
    name_01._M_str = pcVar7;
    name_01._M_len = **(size_t **)(pFVar5 + 8);
    (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              ((string *)local_b8,(_anonymous_namespace_ *)(*(size_t **)(pFVar5 + 8))[1],name_01,
               (bool)uVar10);
    pcVar7 = "c_name";
    text_04._M_str =
         "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, set$camel_name$, arginfo_setter, ZEND_ACC_PUBLIC)\n"
    ;
    text_04._M_len = 0x88;
    pbVar11 = &c_name;
    io::Printer::Print<char[7],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,text_04,(char (*) [7])0x3ee61e,&c_name,(char (*) [11])0x36f86e,
               (string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
  }
  for (iVar8 = 0; uVar10 = SUB81(pbVar11,0), iVar8 < *(int *)(message + 0x7c); iVar8 = iVar8 + 1) {
    pOVar6 = Descriptor::oneof_decl(message,iVar8);
    name_02._M_str = pcVar7;
    name_02._M_len = **(size_t **)(pOVar6 + 8);
    (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              ((string *)local_b8,(_anonymous_namespace_ *)(*(size_t **)(pOVar6 + 8))[1],name_02,
               (bool)uVar10);
    pcVar7 = "c_name";
    text_05._M_str = "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n";
    text_05._M_len = 0x43;
    pbVar11 = &c_name;
    io::Printer::Print<char[7],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,text_05,(char (*) [7])0x3ee61e,&c_name,(char (*) [11])0x36f86e,
               (string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
  }
  bVar4 = (byte)message[1] >> 2 & 0x1f;
  if (bVar4 == 10) {
    pcVar7 = 
    "  PHP_ME($c_name$, is, arginfo_is, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, pack, arginfo_setter, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, unpack, arginfo_void, ZEND_ACC_PUBLIC)\n"
    ;
    sVar9 = 0xa8;
  }
  else {
    if (bVar4 != 0xd) goto LAB_002738ad;
    pcVar7 = 
    "  PHP_ME($c_name$, fromDateTime, arginfo_timestamp_fromdatetime, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, toDateTime, arginfo_void, ZEND_ACC_PUBLIC)\n"
    ;
    sVar9 = 0x90;
  }
  text_06._M_str = pcVar7;
  text_06._M_len = sVar9;
  io::Printer::Print<char[7],std::__cxx11::string>(printer,text_06,(char (*) [7])0x3ee61e,&c_name);
LAB_002738ad:
  text_07._M_str =
       "  ZEND_FE_END\n};\n\nstatic void $c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n                   $c_name$_phpmethods);\n\n  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n  $c_name$_ce->ce_flags |= ZEND_ACC_FINAL;\n  $c_name$_ce->create_object = Message_create;\n  zend_do_inheritance($c_name$_ce, message_ce);\n}\n\n"
  ;
  text_07._M_len = 0x169;
  io::Printer::Print<char[7],std::__cxx11::string,char[9],std::__cxx11::string>
            (printer,text_07,(char (*) [7])0x3ee61e,&c_name,(char (*) [9])"php_name",&php_name);
  for (iVar8 = 0; iVar8 < *(int *)(message + 0x80); iVar8 = iVar8 + 1) {
    message_00 = Descriptor::nested_type(message,iVar8);
    GenerateCMessage(message_00,printer);
  }
  for (iVar8 = 0; iVar8 < *(int *)(message + 0x84); iVar8 = iVar8 + 1) {
    desc = Descriptor::enum_type(message,iVar8);
    GenerateCEnum(desc,printer);
  }
  std::__cxx11::string::~string((string *)&php_name);
  std::__cxx11::string::~string((string *)&c_name);
  return;
}

Assistant:

void GenerateCMessage(const Descriptor* message, io::Printer* printer) {
  std::string c_name = absl::StrReplaceAll(message->full_name(), {{".", "_"}});
  std::string php_name =
      absl::StrReplaceAll(FullClassName(message, Options()), {{"\\", "\\\\"}});
  printer->Print(
      "/* $c_name$ */\n"
      "\n"
      "zend_class_entry* $c_name$_ce;\n"
      "\n"
      "static PHP_METHOD($c_name$, __construct) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  zim_Message___construct(INTERNAL_FUNCTION_PARAM_PASSTHRU);\n"
      "}\n"
      "\n",
      "file_c_name", FilenameCName(message->file()), "c_name", c_name);

  for (int i = 0; i < message->field_count(); i++) {
    auto field = message->field(i);
    printer->Print(
        "static PHP_METHOD($c_name$, get$camel_name$) {\n"
        "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
        "  const upb_FieldDef *f = upb_MessageDef_FindFieldByName(\n"
        "      intern->desc->msgdef, \"$name$\");\n"
        "  zval ret;\n"
        "  Message_get(intern, f, &ret);\n"
        "  RETURN_COPY_VALUE(&ret);\n"
        "}\n"
        "\n"
        "static PHP_METHOD($c_name$, set$camel_name$) {\n"
        "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
        "  const upb_FieldDef *f = upb_MessageDef_FindFieldByName(\n"
        "      intern->desc->msgdef, \"$name$\");\n"
        "  zval *val;\n"
        "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"z\", &val)\n"
        "      == FAILURE) {\n"
        "    return;\n"
        "  }\n"
        "  Message_set(intern, f, val);\n"
        "  RETURN_COPY(getThis());\n"
        "}\n"
        "\n",
        "c_name", c_name, "name", field->name(), "camel_name",
        UnderscoresToCamelCase(field->name(), true));
  }

  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    auto oneof = message->oneof_decl(i);
    printer->Print(
        "static PHP_METHOD($c_name$, get$camel_name$) {\n"
        "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
        "  const upb_OneofDef *oneof = upb_MessageDef_FindOneofByName(\n"
        "      intern->desc->msgdef, \"$name$\");\n"
        "  const upb_FieldDef *field = \n"
        "      upb_Message_WhichOneofByDef(intern->msg, oneof);\n"
        "  RETURN_STRING(field ? upb_FieldDef_Name(field) : \"\");\n"
        "}\n",
        "c_name", c_name, "name", oneof->name(), "camel_name",
        UnderscoresToCamelCase(oneof->name(), true));
  }

  switch (message->well_known_type()) {
    case Descriptor::WELLKNOWNTYPE_ANY:
      printer->Print(
          "ZEND_BEGIN_ARG_INFO_EX(arginfo_is, 0, 0, 1)\n"
          "  ZEND_ARG_INFO(0, proto)\n"
          "ZEND_END_ARG_INFO()\n"
          "\n");
      break;
    case Descriptor::WELLKNOWNTYPE_TIMESTAMP:
      printer->Print(
          "ZEND_BEGIN_ARG_INFO_EX(arginfo_timestamp_fromdatetime, 0, 0, 1)\n"
          "  ZEND_ARG_INFO(0, datetime)\n"
          "ZEND_END_ARG_INFO()\n"
          "\n");
      break;
    default:
      break;
  }

  printer->Print(
      "static zend_function_entry $c_name$_phpmethods[] = {\n"
      "  PHP_ME($c_name$, __construct, arginfo_construct, ZEND_ACC_PUBLIC)\n",
      "c_name", c_name);

  for (int i = 0; i < message->field_count(); i++) {
    auto field = message->field(i);
    printer->Print(
        "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n"
        "  PHP_ME($c_name$, set$camel_name$, arginfo_setter, "
        "ZEND_ACC_PUBLIC)\n",
        "c_name", c_name, "camel_name",
        UnderscoresToCamelCase(field->name(), true));
  }

  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    auto oneof = message->oneof_decl(i);
    printer->Print(
        "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n",
        "c_name", c_name, "camel_name",
        UnderscoresToCamelCase(oneof->name(), true));
  }

  // Extra hand-written functions added to the well-known types.
  switch (message->well_known_type()) {
    case Descriptor::WELLKNOWNTYPE_ANY:
      printer->Print(
          "  PHP_ME($c_name$, is, arginfo_is, ZEND_ACC_PUBLIC)\n"
          "  PHP_ME($c_name$, pack, arginfo_setter, ZEND_ACC_PUBLIC)\n"
          "  PHP_ME($c_name$, unpack, arginfo_void, ZEND_ACC_PUBLIC)\n",
          "c_name", c_name);
      break;
    case Descriptor::WELLKNOWNTYPE_TIMESTAMP:
      printer->Print(
          "  PHP_ME($c_name$, fromDateTime, arginfo_timestamp_fromdatetime, "
          "ZEND_ACC_PUBLIC)\n"
          "  PHP_ME($c_name$, toDateTime, arginfo_void, ZEND_ACC_PUBLIC)\n",
          "c_name", c_name);
      break;
    default:
      break;
  }

  printer->Print(
      "  ZEND_FE_END\n"
      "};\n"
      "\n"
      "static void $c_name$_ModuleInit() {\n"
      "  zend_class_entry tmp_ce;\n"
      "\n"
      "  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n"
      "                   $c_name$_phpmethods);\n"
      "\n"
      "  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n"
      "  $c_name$_ce->ce_flags |= ZEND_ACC_FINAL;\n"
      "  $c_name$_ce->create_object = Message_create;\n"
      "  zend_do_inheritance($c_name$_ce, message_ce);\n"
      "}\n"
      "\n",
      "c_name", c_name, "php_name", php_name);

  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateCMessage(message->nested_type(i), printer);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateCEnum(message->enum_type(i), printer);
  }
}